

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_ignoreSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char **ppcVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar3;
  int iVar4;
  byte *pbVar5;
  
  if (ptr == end) {
    return -1;
  }
  iVar4 = 0;
  ppcVar2 = nextTokPtr;
  pcVar3 = end;
LAB_00155fce:
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    pbVar5 = (byte *)ptr + 1;
    if (pbVar5 == (byte *)end) {
      return -1;
    }
    if (*pbVar5 == 0x21) {
      pbVar5 = (byte *)ptr + 2;
      if (pbVar5 == (byte *)end) {
        return -1;
      }
      if (*pbVar5 == 0x5b) {
        iVar4 = iVar4 + 1;
        goto LAB_0015606c;
      }
    }
    goto LAB_001560c7;
  default:
    pbVar5 = (byte *)ptr + 1;
    goto LAB_001560c7;
  case 4:
    pbVar5 = (byte *)ptr + 1;
    if (pbVar5 == (byte *)end) {
      return -1;
    }
    if (*pbVar5 == 0x5d) {
      pbVar5 = (byte *)ptr + 2;
      if (pbVar5 == (byte *)end) {
        return -1;
      }
      if (*pbVar5 == 0x3e) {
        ptr = (char *)((byte *)ptr + 3);
        if (iVar4 == 0) {
          iVar4 = 0x2a;
          goto LAB_001560d4;
        }
        iVar4 = iVar4 + -1;
        pbVar5 = (byte *)ptr;
      }
    }
LAB_001560c7:
    ptr = (char *)pbVar5;
    if (pbVar5 == (byte *)end) {
      return -1;
    }
    goto LAB_00155fce;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar1 = (*enc[3].scanners[2])(enc,ptr,pcVar3,ppcVar2);
    if (iVar1 == 0) {
      pcVar3 = extraout_RDX_01;
      pbVar5 = (byte *)ptr + 2;
      goto LAB_001560c7;
    }
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar1 = (*enc[3].scanners[3])(enc,ptr,pcVar3,ppcVar2);
    pcVar3 = extraout_RDX_00;
    if (iVar1 == 0) {
LAB_0015606c:
      pbVar5 = (byte *)ptr + 3;
      goto LAB_001560c7;
    }
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar1 = (*enc[3].literalScanners[0])(enc,ptr,pcVar3,ppcVar2);
    if (iVar1 == 0) {
      pcVar3 = extraout_RDX;
      pbVar5 = (byte *)ptr + 4;
      goto LAB_001560c7;
    }
  }
  iVar4 = 0;
LAB_001560d4:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static
int PREFIX(ignoreSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                             const char **nextTokPtr)
{
  int level = 0;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      end = ptr + n;
    }
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_LT:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_EXCL)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_LSQB)) {
          ++level;
          ptr += MINBPC(enc);
        }
      }
      break;
    case BT_RSQB:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
          ptr += MINBPC(enc);
          if (level == 0) {
            *nextTokPtr = ptr;
            return XML_TOK_IGNORE_SECT;
          }
          --level;
        }
      }
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}